

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  ulong uVar1;
  mp_ptr rp;
  mp_limb_t mVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  mp_limb_t __u;
  ulong uVar12;
  
  if (inv->shift == 0) {
    rp = (mp_ptr)0x0;
    mVar2 = 0;
  }
  else {
    rp = (mp_ptr)(*gmp_allocate_func)(nn * 8);
    mVar2 = mpn_lshift(rp,np,nn,inv->shift);
    np = rp;
  }
  if (0 < nn) {
    uVar1 = inv->d1;
    uVar4 = inv->di & 0xffffffff;
    uVar5 = inv->di >> 0x20;
    uVar12 = nn + 1;
    do {
      uVar10 = (mVar2 & 0xffffffff) * uVar4;
      uVar11 = (mVar2 >> 0x20) * uVar4;
      lVar9 = (mVar2 >> 0x20) * uVar5;
      uVar6 = (mVar2 & 0xffffffff) * uVar5 + uVar11 + (uVar10 >> 0x20);
      lVar7 = lVar9 + 0x100000000;
      if (uVar11 <= uVar6) {
        lVar7 = lVar9;
      }
      uVar11 = uVar10 & 0xffffffff | uVar6 << 0x20;
      uVar10 = np[uVar12 - 2];
      uVar8 = uVar11 + uVar10;
      lVar7 = mVar2 + 1 + (uVar6 >> 0x20) + lVar7 + (ulong)CARRY8(uVar11,uVar10);
      uVar10 = uVar10 - lVar7 * uVar1;
      uVar6 = 0;
      if (uVar8 < uVar10) {
        uVar6 = uVar1;
      }
      uVar6 = uVar6 + uVar10;
      uVar11 = 0;
      if (uVar1 <= uVar6) {
        uVar11 = uVar1;
      }
      if (qp != (mp_ptr)0x0) {
        qp[uVar12 - 2] = ((lVar7 - (ulong)(uVar8 < uVar10)) + 1) - (ulong)(uVar6 < uVar1);
      }
      mVar2 = uVar6 - uVar11;
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  if (inv->shift == 0) {
    bVar3 = 0;
  }
  else {
    (*gmp_free_func)(rp,0);
    bVar3 = (byte)inv->shift;
  }
  return mVar2 >> (bVar3 & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;

  if (inv->shift > 0)
    {
      tp = gmp_xalloc_limbs (nn);
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (inv->shift > 0)
    gmp_free (tp);

  return r >> inv->shift;
}